

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O3

bool __thiscall
PDA::inStackAlphabet
          (PDA *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *s)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  pointer pbVar4;
  string c;
  string local_78;
  long *local_58;
  long local_50;
  long local_48 [2];
  PDA *local_38;
  
  pbVar4 = (s->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (s->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 == pbVar1) {
    bVar3 = true;
  }
  else {
    bVar3 = true;
    local_38 = this;
    do {
      pcVar2 = (pbVar4->_M_dataplus)._M_p;
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + pbVar4->_M_string_length);
      if (bVar3 == false) {
        bVar3 = false;
      }
      else {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,local_58,local_50 + (long)local_58);
        bVar3 = inStackAlphabet(local_38,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  return bVar3;
}

Assistant:

bool PDA::inStackAlphabet(std::vector<std::string> s) {
    bool in = true;
    for (std::string c: s) {
        in = in && inStackAlphabet(c);
    }
    return in;
}